

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O2

void reoProfileNodesStart(reo_man *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = p->nSupp;
  lVar5 = 0x18;
  iVar3 = 0;
  for (lVar4 = 0; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
    iVar2 = *(int *)((long)p->pPlanes + lVar5 + -0x14);
    *(double *)((long)&p->pPlanes->fSifted + lVar5) = (double)iVar2;
    iVar3 = iVar3 + iVar2;
    lVar5 = lVar5 + 0x38;
  }
  if (iVar3 == p->nNodesCur) {
    p->nNodesBeg = iVar3;
    return;
  }
  __assert_fail("Total == p->nNodesCur",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/reo/reoProfile.c"
                ,0x37,"void reoProfileNodesStart(reo_man *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////


////////////////////////////////////////////////////////////////////////
///                    FUNCTION DEFINITIONS                          ///
////////////////////////////////////////////////////////////////////////


/**Function********************************************************************

  Synopsis    [Start the profile for the BDD nodes.]

  Description [TopRef is the first level, on this the given node counts towards 
  the width of the BDDs. (In other words, it is the level of the referencing node plus 1.)]

  SideEffects []

  SeeAlso     []

******************************************************************************/
void reoProfileNodesStart( reo_man * p )
{
	int Total, i;
	Total = 0;
	for ( i = 0; i <= p->nSupp; i++ )
	{
		p->pPlanes[i].statsCost = p->pPlanes[i].statsNodes;
		Total += p->pPlanes[i].statsNodes;
	}
	assert( Total == p->nNodesCur );
	p->nNodesBeg = p->nNodesCur;
}